

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.cc
# Opt level: O3

void __thiscall flow::PassManager::run(PassManager *this,IRHandler *handler)

{
  char cVar1;
  size_t in_RCX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  _List_node_base *p_Var2;
  char *ctx;
  uchar *in_R8;
  size_t in_R9;
  int local_84;
  IRHandler *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    p_Var2 = (this->handlerPasses_).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this) {
      logDebug<int>(this,"{} changes detected",0);
      return;
    }
    local_84 = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,
                 *(size_t *)
                  &((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                     *)(p_Var2 + 1))->
                   super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                 ,(long)&(*(_List_node_base **)
                           &((PassManager *)((long)(p_Var2 + 1) + 8))->handlerPasses_)->_M_next +
                  *(size_t *)
                   &((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                      *)(p_Var2 + 1))->
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                );
      logDebug<std::__cxx11::string>(this,"executing pass {}:",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_78 = handler;
      if ((((PassManager *)(p_Var2 + 3))->handlerPasses_).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
          ._M_impl._M_node._M_size == 0) {
        std::__throw_bad_function_call();
      }
      cVar1 = (*(code *)*(_List_node_base **)
                         &((PassManager *)((long)(p_Var2 + 4) + 8))->handlerPasses_)
                        ((PassManager *)(p_Var2 + 3),&local_78);
      if (cVar1 != '\0') {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,
                   *(size_t *)
                    &((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                       *)(p_Var2 + 1))->
                     super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                   ,(long)&(*(_List_node_base **)
                             &((PassManager *)((long)(p_Var2 + 1) + 8))->handlerPasses_)->_M_next +
                    *(size_t *)
                     &((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                        *)(p_Var2 + 1))->
                      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                  );
        ctx = "pass {}: changes detected";
        logDebug<std::__cxx11::string>(this,"pass {}: changes detected",&local_70);
        sig = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          ctx = (char *)(local_70.field_2._M_allocated_capacity + 1);
          operator_delete(local_70._M_dataplus._M_p,(ulong)ctx);
          sig = extraout_RDX_00;
        }
        IRHandler::verify(handler,(EVP_PKEY_CTX *)ctx,sig,in_RCX,in_R8,in_R9);
        local_84 = local_84 + 1;
      }
      p_Var2 = (((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                  *)&p_Var2->_M_next)->
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)this);
    logDebug<int>(this,"{} changes detected",local_84);
    if (local_84 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void PassManager::run(IRHandler* handler) {
  for (;;) {
    int changes = 0;
    for (const std::pair<std::string, HandlerPass>& pass : handlerPasses_) {
      logDebug("executing pass {}:", pass.first);
      if (pass.second(handler)) {
        logDebug("pass {}: changes detected", pass.first);
        handler->verify();
        changes++;
      }
    }
    logDebug("{} changes detected", changes);
    if (!changes) {
      break;
    }
  }
}